

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

int ON_SubDComponentAndPoint::CompareComponent
              (ON_SubDComponentAndPoint *lhs,ON_SubDComponentAndPoint *rhs)

{
  int iVar1;
  
  if (lhs == rhs) {
    return 0;
  }
  if (lhs != (ON_SubDComponentAndPoint *)0x0) {
    if (rhs == (ON_SubDComponentAndPoint *)0x0) {
      return 1;
    }
    iVar1 = ON_SubDComponentPtr::CompareComponent(&lhs->m_cptr,&rhs->m_cptr);
    return iVar1;
  }
  return -1;
}

Assistant:

int ON_SubDComponentAndPoint::CompareComponent(
  const ON_SubDComponentAndPoint* lhs,
  const ON_SubDComponentAndPoint* rhs
)
{
  if (lhs == rhs)
    return 0;
  if (nullptr == lhs)
    return -1;
  if (nullptr == rhs)
    return 1;
  return ON_SubDComponentPtr::CompareComponent(&lhs->m_cptr, &rhs->m_cptr);
}